

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

Node * __thiscall
czh::node::Node::add<czh::value::Value&,void>
          (Node *this,string *add_name,Value *_value,string *before,Token *token,source_location *l)

{
  NodeData *this_00;
  Node *pNVar1;
  Token local_1c0;
  Value local_160;
  string local_138;
  Node local_118;
  Node *local_50;
  Node *ret;
  NodeData *pNStack_40;
  int err;
  NodeData *nd;
  source_location *l_local;
  Token *token_local;
  string *before_local;
  Value *_value_local;
  string *add_name_local;
  Node *this_local;
  
  nd = (NodeData *)l;
  l_local = (source_location *)token;
  token_local = (Token *)before;
  before_local = (string *)_value;
  _value_local = (Value *)add_name;
  add_name_local = &this->name;
  assert_node(this,l);
  this_00 = std::get<czh::node::Node::NodeData,czh::node::Node::NodeData,czh::value::Value>
                      (&this->data);
  ret._4_4_ = 0;
  pNStack_40 = this_00;
  std::__cxx11::string::string((string *)&local_138,add_name);
  czh::value::Value::Value(&local_160,(Value *)before_local);
  czh::token::Token::Token(&local_1c0,token);
  Node(&local_118,this,&local_138,&local_160,&local_1c0);
  pNVar1 = NodeData::add(this_00,&local_118,(string *)token_local,(int *)((long)&ret + 4));
  ~Node(&local_118);
  czh::token::Token::~Token(&local_1c0);
  czh::value::Value::~Value(&local_160);
  std::__cxx11::string::~string((string *)&local_138);
  local_50 = pNVar1;
  if (ret._4_4_ != 0) {
    report_no_node(this,(string *)token_local,(source_location *)nd);
  }
  return local_50;
}

Assistant:

Node &add(std::string add_name, T &&_value, const std::string &before = "", token::Token token = token::Token(),
              const std::source_location &l =
              std::source_location::current())
    {
      assert_node(l);
      auto &nd = std::get<NodeData>(data);
      int err = 0;
      auto ret = nd.add(Node(this, std::move(add_name), Value(std::forward<T>(_value)), std::move(token)), before,
                        err);
      if (err != 0) report_no_node(before, l);
      return *ret;
    }